

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

bool check_more_than_two_unique_values<double>
               (size_t *ix_arr,size_t st,size_t end,double *x,MissingAction missing_action)

{
  size_t *psVar1;
  ulong uVar2;
  double in_XMM0_Qa;
  
  if (1 < end - st) {
    if (missing_action == Fail) {
      psVar1 = ix_arr + st;
      uVar2 = st + 1;
      do {
        st = uVar2;
        if (end < st) {
          return false;
        }
      } while ((x[ix_arr[st]] == x[*psVar1]) &&
              (uVar2 = st + 1, !NAN(x[ix_arr[st]]) && !NAN(x[*psVar1])));
    }
    else {
      if (st <= end) {
        do {
          in_XMM0_Qa = x[ix_arr[st]];
          st = st + 1;
        } while (0x7fefffffffffffff < (ulong)ABS(in_XMM0_Qa) && st <= end);
      }
      if (end < st) {
        return false;
      }
      if (in_XMM0_Qa == x[ix_arr[st]] || 0x7fefffffffffffff < (ulong)ABS(x[ix_arr[st]])) {
        do {
          st = st + 1;
          if (end < st) {
            return false;
          }
        } while (in_XMM0_Qa == x[ix_arr[st]] || 0x7fefffffffffffff < (ulong)ABS(x[ix_arr[st]]));
      }
    }
    if (st <= end) {
      return true;
    }
  }
  return false;
}

Assistant:

bool check_more_than_two_unique_values(size_t ix_arr[], size_t st, size_t end, real_t x[], MissingAction missing_action)
{
    if (end - st <= 1) return false;

    if (missing_action == Fail)
    {
        real_t x0 = x[ix_arr[st]];
        for (size_t ix = st+1; ix <= end; ix++)
        {
            if (x[ix_arr[ix]] != x0) return true;
        }
    }

    else
    {
        real_t x0;
        size_t ix;
        for (ix = st; ix <= end; ix++)
        {
            if (likely(!is_na_or_inf(x[ix_arr[ix]])))
            {
                x0 = x[ix_arr[ix]];
                ix++;
                break;
            }
        }

        for (; ix <= end; ix++)
        {
            if (!is_na_or_inf(x[ix_arr[ix]]) && x[ix_arr[ix]] != x0)
                return true;
        }
    }

    return false;
}